

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O2

void __thiscall salsa20::salsa20(salsa20 *this,string *key,string *nonce)

{
  char *pcVar1;
  ulong uVar2;
  value_type_conflict local_54;
  array<unsigned_char,_8UL> nonce_array;
  array<unsigned_char,_32UL> key_array;
  
  key_array._M_elems[0x10] = '\0';
  key_array._M_elems[0x11] = '\0';
  key_array._M_elems[0x12] = '\0';
  key_array._M_elems[0x13] = '\0';
  key_array._M_elems[0x14] = '\0';
  key_array._M_elems[0x15] = '\0';
  key_array._M_elems[0x16] = '\0';
  key_array._M_elems[0x17] = '\0';
  key_array._M_elems[0x18] = '\0';
  key_array._M_elems[0x19] = '\0';
  key_array._M_elems[0x1a] = '\0';
  key_array._M_elems[0x1b] = '\0';
  key_array._M_elems[0x1c] = '\0';
  key_array._M_elems[0x1d] = '\0';
  key_array._M_elems[0x1e] = '\0';
  key_array._M_elems[0x1f] = '\0';
  key_array._M_elems[0] = '\0';
  key_array._M_elems[1] = '\0';
  key_array._M_elems[2] = '\0';
  key_array._M_elems[3] = '\0';
  key_array._M_elems[4] = '\0';
  key_array._M_elems[5] = '\0';
  key_array._M_elems[6] = '\0';
  key_array._M_elems[7] = '\0';
  key_array._M_elems[8] = '\0';
  key_array._M_elems[9] = '\0';
  key_array._M_elems[10] = '\0';
  key_array._M_elems[0xb] = '\0';
  key_array._M_elems[0xc] = '\0';
  key_array._M_elems[0xd] = '\0';
  key_array._M_elems[0xe] = '\0';
  key_array._M_elems[0xf] = '\0';
  pcVar1 = (key->_M_dataplus)._M_p;
  uVar2 = 0x20;
  if (key->_M_string_length < 0x20) {
    uVar2 = key->_M_string_length;
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char_const*,unsigned_char*>(pcVar1,pcVar1 + uVar2,key_array._M_elems);
  nonce_array._M_elems[0] = '\0';
  nonce_array._M_elems[1] = '\0';
  nonce_array._M_elems[2] = '\0';
  nonce_array._M_elems[3] = '\0';
  nonce_array._M_elems[4] = '\0';
  nonce_array._M_elems[5] = '\0';
  nonce_array._M_elems[6] = '\0';
  nonce_array._M_elems[7] = '\0';
  pcVar1 = (nonce->_M_dataplus)._M_p;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char_const*,unsigned_char*>(pcVar1,pcVar1 + 8,nonce_array._M_elems);
  local_54 = 0;
  std::array<unsigned_int,_16UL>::fill(&this->m_array,&local_54);
  (this->m_array)._M_elems[0] = 0x63617571;
  *(undefined8 *)((this->m_array)._M_elems + 1) = key_array._M_elems._0_8_;
  *(undefined8 *)((this->m_array)._M_elems + 3) = key_array._M_elems._8_8_;
  (this->m_array)._M_elems[5] = 0x6f63206b;
  *(_Type *)((this->m_array)._M_elems + 6) = nonce_array._M_elems;
  (this->m_array)._M_elems[10] = 0x6174736e;
  *(undefined8 *)((this->m_array)._M_elems + 0xb) = key_array._M_elems._16_8_;
  *(undefined8 *)((this->m_array)._M_elems + 0xd) = key_array._M_elems._24_8_;
  (this->m_array)._M_elems[0xf] = 0x2121746e;
  return;
}

Assistant:

salsa20::salsa20(const std::string &key, const std::string &nonce)
{
    /* if key size is not same sizes::key_size
     * copy part of key, or all key bytes and fill other by 0x0
     */
    std::array<uint8_t, sizes::key_size> key_array;
    key_array.fill(0x0);
    long minimal_size = sizes::key_size < key.length() ? sizes::key_size : static_cast<long>(key.length());
    std::copy(key.begin(), key.begin() + minimal_size, key_array.data());

    std::array<uint8_t, sizes::nonce_size> nonce_array;
    nonce_array.fill(0x0);
    minimal_size = sizes::nonce_size < nonce.length() ? sizes::key_size : static_cast<long>(nonce.length());
    std::copy(nonce.begin(), nonce.begin() + nonce_array.size(), nonce_array.data());

    m_array.fill(0x0);

    // initial state of array
    m_array[0] = convert(&constants[0]);
    m_array[1] = convert(&key_array[0]);
    m_array[2] = convert(&key_array[4]);
    m_array[3] = convert(&key_array[8]);
    m_array[4] = convert(&key_array[12]);
    m_array[5] = convert(&constants[4]);

    m_array[6] = convert(&nonce_array[0]);
    m_array[7] = convert(&nonce_array[sizeof (uint32_t)]);

    m_array[10] = convert(&constants[8]);
    m_array[11] = convert(&key_array[16]);
    m_array[12] = convert(&key_array[20]);
    m_array[13] = convert(&key_array[24]);
    m_array[14] = convert(&key_array[28]);
    m_array[15] = convert(&constants[12]);
}